

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der_writer.c
# Opt level: O0

int int_put_bytes_ulong(WPACKET *pkt,void *v,uint *top_byte)

{
  int iVar1;
  ulong uVar2;
  uint *in_RDX;
  ulong *in_RSI;
  size_t n;
  unsigned_long tmp;
  unsigned_long *value;
  size_t in_stack_ffffffffffffffc8;
  long lVar3;
  
  lVar3 = 0;
  for (uVar2 = *in_RSI; uVar2 != 0; uVar2 = uVar2 >> 8) {
    lVar3 = lVar3 + 1;
    *in_RDX = (uint)uVar2 & 0xff;
  }
  if (lVar3 == 0) {
    lVar3 = 0;
  }
  iVar1 = WPACKET_put_bytes__((WPACKET *)0x0,(uint)((ulong)lVar3 >> 0x20),in_stack_ffffffffffffffc8)
  ;
  return iVar1;
}

Assistant:

static int int_put_bytes_ulong(WPACKET *pkt, const void *v,
                               unsigned int *top_byte)
{
    const unsigned long *value = v;
    unsigned long tmp = *value;
    size_t n = 0;

    while (tmp != 0) {
        n++;
        *top_byte = (tmp & 0xFF);
        tmp >>= 8;
    }
    if (n == 0)
        n = 1;

    return WPACKET_put_bytes__(pkt, *value, n);
}